

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Medals.cpp
# Opt level: O2

void addNoob(PlayerInfo *player,int amount)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  unsigned_long uVar4;
  char *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  string sStack_38;
  
  rhs._M_str = in_RCX;
  rhs._M_len = (size_t)"Player";
  bVar1 = jessilib::starts_withi<char,char>
                    ((jessilib *)&player->uuid,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6,rhs);
  if ((!bVar1) && (player->isBot == false)) {
    puVar2 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
    uVar3 = Jupiter::Config::operator[](&player->varData,puVar2[1],*puVar2);
    uVar4 = getNoobs(player);
    string_printf_abi_cxx11_(&sStack_38,"%u",(long)amount + uVar4);
    Jupiter::Config::set(uVar3,5,"Noobs",&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return;
}

Assistant:

void addNoob(const RenX::PlayerInfo &player, int amount) {
	if (!jessilib::starts_withi(player.uuid, "Player"sv) && !player.isBot) {
		player.varData[pluginInstance.getName()].set("Noobs"sv,static_cast<std::string>(string_printf("%u", getNoobs(player) + amount)));
	}
}